

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O0

char * minimum_size_type(int lwr,int upr,int *pnByte)

{
  int local_24;
  char *pcStack_20;
  int nByte;
  char *zType;
  int *pnByte_local;
  int upr_local;
  int lwr_local;
  
  pcStack_20 = "int";
  local_24 = 4;
  if (lwr < 0) {
    if ((lwr < -0x7f) || (0x7f < upr)) {
      if ((-0x8000 < lwr) && (upr < 0x7fff)) {
        pcStack_20 = "short";
        local_24 = 2;
      }
    }
    else {
      pcStack_20 = "signed char";
      local_24 = 1;
    }
  }
  else if (upr < 0x100) {
    pcStack_20 = "unsigned char";
    local_24 = 1;
  }
  else if (upr < 0xffff) {
    pcStack_20 = "unsigned short int";
    local_24 = 2;
  }
  else {
    pcStack_20 = "unsigned int";
    local_24 = 4;
  }
  if (pnByte != (int *)0x0) {
    *pnByte = local_24;
  }
  return pcStack_20;
}

Assistant:

static const char *minimum_size_type(int lwr, int upr, int *pnByte){
  const char *zType = "int";
  int nByte = 4;
  if( lwr>=0 ){
    if( upr<=255 ){
      zType = "unsigned char";
      nByte = 1;
    }else if( upr<65535 ){
      zType = "unsigned short int";
      nByte = 2;
    }else{
      zType = "unsigned int";
      nByte = 4;
    }
  }else if( lwr>=-127 && upr<=127 ){
    zType = "signed char";
    nByte = 1;
  }else if( lwr>=-32767 && upr<32767 ){
    zType = "short";
    nByte = 2;
  }
  if( pnByte ) *pnByte = nByte;
  return zType;
}